

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

void __thiscall
wasm::Precompute::reuseConstantNode<wasm::Return>(Precompute *this,Return *curr,Flow *flow)

{
  bool bVar1;
  size_t sVar2;
  Literal *other;
  Module *module;
  Expression *pEVar3;
  bool local_ca;
  string_view local_90;
  RefFunc *local_80;
  RefFunc *r;
  HeapType local_70;
  char *local_68;
  RefNull *local_60;
  RefNull *n;
  Const *local_50;
  Const *c;
  undefined1 local_38 [8];
  Literal singleValue;
  Flow *flow_local;
  Return *curr_local;
  Precompute *this_local;
  
  singleValue.type.id = (uintptr_t)flow;
  bVar1 = Literals::isConcrete(&flow->values);
  if (!bVar1) {
    curr->value = (Expression *)0x0;
    goto LAB_0195cf7c;
  }
  if (curr->value != (Expression *)0x0) {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size((SmallVector<wasm::Literal,_1UL> *)flow);
    if (sVar2 == 1) {
      other = Flow::getSingleValue(flow);
      wasm::Literal::Literal((Literal *)local_38,other);
      bVar1 = wasm::Type::isNumber((Type *)&singleValue.field_0.func.super_IString.str._M_str);
      if (bVar1) {
        local_50 = Expression::dynCast<wasm::Const>(curr->value);
        if (local_50 == (Const *)0x0) goto LAB_0195cf27;
        wasm::Literal::operator=(&local_50->value,(Literal *)local_38);
        Const::finalize(local_50);
        Expression::finalize((Expression *)curr);
        n._4_4_ = 1;
      }
      else {
        bVar1 = wasm::Literal::isNull((Literal *)local_38);
        if (bVar1) {
          local_60 = Expression::dynCast<wasm::RefNull>(curr->value);
          if (local_60 == (RefNull *)0x0) goto LAB_0195cf27;
          local_68 = singleValue.field_0.func.super_IString.str._M_str;
          RefNull::finalize(local_60,(Type)singleValue.field_0.gcData.
                                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
          Expression::finalize((Expression *)curr);
          n._4_4_ = 1;
        }
        else {
          bVar1 = wasm::Type::isRef((Type *)&singleValue.field_0.func.super_IString.str._M_str);
          local_ca = false;
          if (bVar1) {
            local_70 = wasm::Type::getHeapType
                                 ((Type *)&singleValue.field_0.func.super_IString.str._M_str);
            r._4_4_ = 1;
            local_ca = HeapType::operator==(&local_70,(BasicHeapType *)((long)&r + 4));
          }
          if ((local_ca == false) ||
             (local_80 = Expression::dynCast<wasm::RefFunc>(curr->value), local_80 == (RefFunc *)0x0
             )) {
LAB_0195cf27:
            n._4_4_ = 0;
          }
          else {
            local_90 = (string_view)wasm::Literal::getFunc((Literal *)local_38);
            wasm::Name::operator=(&local_80->func,(Name *)&local_90);
            RefFunc::finalize(local_80);
            Expression::finalize((Expression *)curr);
            n._4_4_ = 1;
          }
        }
      }
      wasm::Literal::~Literal((Literal *)local_38);
      if (n._4_4_ != 0) {
        return;
      }
    }
  }
  module = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                      ).
                      super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                      .
                      super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                    );
  pEVar3 = Flow::getConstExpression(flow,module);
  curr->value = pEVar3;
LAB_0195cf7c:
  Expression::finalize((Expression *)curr);
  return;
}

Assistant:

void reuseConstantNode(T* curr, Flow flow) {
    if (flow.values.isConcrete()) {
      // reuse a const / ref.null / ref.func node if there is one
      if (curr->value && flow.values.size() == 1) {
        Literal singleValue = flow.getSingleValue();
        if (singleValue.type.isNumber()) {
          if (auto* c = curr->value->template dynCast<Const>()) {
            c->value = singleValue;
            c->finalize();
            curr->finalize();
            return;
          }
        } else if (singleValue.isNull()) {
          if (auto* n = curr->value->template dynCast<RefNull>()) {
            n->finalize(singleValue.type);
            curr->finalize();
            return;
          }
        } else if (singleValue.type.isRef() &&
                   singleValue.type.getHeapType() == HeapType::func) {
          if (auto* r = curr->value->template dynCast<RefFunc>()) {
            r->func = singleValue.getFunc();
            r->finalize();
            curr->finalize();
            return;
          }
        }
      }
      curr->value = flow.getConstExpression(*getModule());
    } else {
      curr->value = nullptr;
    }
    curr->finalize();
  }